

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

void __thiscall absl::Mutex::Lock(Mutex *this)

{
  ulong uVar1;
  GraphId id;
  SynchLocksHeld *held_locks;
  int iVar2;
  anon_class_1_0_00000001 *fn;
  SchedulingMode in_ESI;
  bool bVar3;
  
  id = DebugOnlyDeadlockCheck(this);
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  if ((uVar1 & 0x19) == 0) {
    LOCK();
    bVar3 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
    if (bVar3) {
      (this->mu_).super___atomic_base<long>._M_i = uVar1 | 8;
    }
    UNLOCK();
    if (bVar3) goto LAB_0014315b;
  }
  if ((anonymous_namespace)::GetMutexGlobals()::data != 0xdd) {
    base_internal::CallOnceImpl<absl::(anonymous_namespace)::GetMutexGlobals()::__0>
              ((atomic<unsigned_int> *)&(anonymous_namespace)::GetMutexGlobals()::data,in_ESI,fn);
  }
  iVar2 = DAT_00180744 + 1;
  do {
    uVar1 = (this->mu_).super___atomic_base<long>._M_i;
    if ((uVar1 & 0x11) != 0) break;
    if ((uVar1 & 8) == 0) {
      LOCK();
      bVar3 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
      if (bVar3) {
        (this->mu_).super___atomic_base<long>._M_i = uVar1 | 8;
      }
      UNLOCK();
      if (bVar3) goto LAB_0014315b;
    }
    iVar2 = iVar2 + -1;
  } while (1 < iVar2);
  Lock(this);
LAB_0014315b:
  if (_ZN4absl12_GLOBAL__N_124synch_deadlock_detectionE_0 == 0) {
    return;
  }
  held_locks = Synch_GetAllLocks();
  LockEnter(this,id,held_locks);
  return;
}

Assistant:

void Mutex::Lock() {
  ABSL_TSAN_MUTEX_PRE_LOCK(this, 0);
  GraphId id = DebugOnlyDeadlockCheck(this);
  intptr_t v = mu_.load(std::memory_order_relaxed);
  // try fast acquire, then spin loop
  if ((v & (kMuWriter | kMuReader | kMuEvent)) != 0 ||
      !mu_.compare_exchange_strong(v, kMuWriter | v,
                                   std::memory_order_acquire,
                                   std::memory_order_relaxed)) {
    // try spin acquire, then slow loop
    if (!TryAcquireWithSpinning(&this->mu_)) {
      this->LockSlow(kExclusive, nullptr, 0);
    }
  }
  DebugOnlyLockEnter(this, id);
  ABSL_TSAN_MUTEX_POST_LOCK(this, 0, 0);
}